

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void __thiscall
FFT::FFTExecutor::complexMultiplication
          (FFTExecutor *this,ComplexData *in1,ComplexData *in2,ComplexData *out)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  undefined8 uVar6;
  kiss_fft_cpx *pkVar7;
  kiss_fft_cpx *pkVar8;
  BaseComplexData<kiss_fft_cpx> *in_RCX;
  BaseComplexData<kiss_fft_cpx> *in_RDX;
  BaseComplexData<kiss_fft_cpx> *in_RSI;
  kiss_fft_cpx *outXEnd;
  kiss_fft_cpx *outX;
  kiss_fft_cpx *in2X;
  kiss_fft_cpx *in1X;
  uint32_t size;
  ComplexData *in_stack_ffffffffffffffa8;
  ComplexData *in_stack_ffffffffffffffb0;
  kiss_fft_cpx *local_48;
  kiss_fft_cpx *local_40;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar2 = equalSize<FFT::ComplexData,FFT::ComplexData>
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((((bVar2) &&
       (bVar2 = equalSize<FFT::ComplexData,FFT::ComplexData>
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), bVar2)) &&
      (uVar3 = BaseComplexData<kiss_fft_cpx>::width(in_RSI), uVar3 != 0)) &&
     (uVar3 = BaseComplexData<kiss_fft_cpx>::height(in_RSI), uVar3 != 0)) {
    uVar3 = BaseComplexData<kiss_fft_cpx>::width(in_RSI);
    uVar4 = BaseComplexData<kiss_fft_cpx>::height(in_RSI);
    uVar5 = uVar3 * uVar4;
    pkVar7 = BaseComplexData<kiss_fft_cpx>::data(in_RSI);
    local_40 = BaseComplexData<kiss_fft_cpx>::data(in_RDX);
    local_48 = BaseComplexData<kiss_fft_cpx>::data(in_RCX);
    pkVar8 = local_48 + uVar5;
    for (; local_48 != pkVar8; local_48 = local_48 + 1) {
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_40->r),ZEXT416((uint)pkVar7->r),
                               ZEXT416((uint)-(pkVar7->i * local_40->i)));
      local_48->r = auVar1._0_4_;
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_40->i),ZEXT416((uint)pkVar7->r),
                               ZEXT416((uint)(pkVar7->i * local_40->r)));
      local_48->i = auVar1._0_4_;
      pkVar7 = pkVar7 + 1;
      local_40 = local_40 + 1;
    }
    return;
  }
  uVar6 = __cxa_allocate_exception(0x28);
  imageException::imageException
            ((imageException *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  __cxa_throw(uVar6,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FFTExecutor::complexMultiplication( const ComplexData & in1, const ComplexData & in2, ComplexData & out ) const
    {
        if ( !equalSize( in1, in2 ) || !equalSize( in1, out ) || in1.width() == 0 || in1.height() == 0 )
            throw imageException( "Invalid parameters for FFTExecutor::complexMultiplication" );

        // in1 = A + iB
        // in2 = C + iD
        // out = in1 * (-in2) = (A + iB) * (-C - iD) = - A * C - i(B * C) - i(A * D) + B * D

        const uint32_t size = in1.width() * in1.height();

        const kiss_fft_cpx * in1X = in1.data();
        const kiss_fft_cpx * in2X = in2.data();
        kiss_fft_cpx * outX = out.data();
        const kiss_fft_cpx * outXEnd = outX + size;

        for ( ; outX != outXEnd; ++in1X, ++in2X, ++outX ) {
            outX->r = in1X->r * in2X->r - in1X->i * in2X->i;
            outX->i = in1X->r * in2X->i + in1X->i * in2X->r;
        }
    }